

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O3

int __thiscall
jrtplib::RTCPSDESInfo::SetPrivateValue
          (RTCPSDESInfo *this,uint8_t *prefix,size_t prefixlen,uint8_t *value,size_t valuelen)

{
  size_t *psVar1;
  RTPMemoryManager *pRVar2;
  _func_int **pp_Var3;
  int iVar4;
  SDESItem *this_00;
  _List_node_base *p_Var5;
  
  for (p_Var5 = (this->privitems).
                super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var5 != (_List_node_base *)&this->privitems; p_Var5 = p_Var5->_M_next) {
    if (p_Var5[1]._M_next[2]._M_prev == (_List_node_base *)prefixlen) {
      if (prefixlen != 0) {
        iVar4 = bcmp(prefix,p_Var5[1]._M_next[2]._M_next,prefixlen);
        if (iVar4 != 0) goto LAB_0012bebc;
      }
      this_00 = (SDESItem *)p_Var5[1]._M_next;
      goto LAB_0012bf71;
    }
LAB_0012bebc:
  }
  iVar4 = -0x38;
  if ((this->privitems).
      super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
      ._M_impl._M_node._M_size < 0x100) {
    pRVar2 = (this->super_RTPMemoryObject).mgr;
    if (pRVar2 == (RTPMemoryManager *)0x0) {
      this_00 = (SDESItem *)operator_new(0x30);
    }
    else {
      this_00 = (SDESItem *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,0x30,0x1e);
    }
    (this_00->super_RTPMemoryObject).mgr = (this->super_RTPMemoryObject).mgr;
    this_00->str = (uint8_t *)0x0;
    this_00->length = 0;
    (this_00->super_RTPMemoryObject)._vptr_RTPMemoryObject =
         (_func_int **)&PTR__SDESPrivateItem_0013ca60;
    this_00[1].super_RTPMemoryObject._vptr_RTPMemoryObject = (_func_int **)0x0;
    this_00[1].super_RTPMemoryObject.mgr = (RTPMemoryManager *)0x0;
    iVar4 = SDESItem::SetString(this_00,(uint8_t **)(this_00 + 1),
                                (size_t *)&this_00[1].super_RTPMemoryObject.mgr,prefix,prefixlen);
    if (-1 < iVar4) {
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = (_List_node_base *)this_00;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(this->privitems).
                super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
LAB_0012bf71:
      iVar4 = SDESItem::SetString(this_00,&this_00->str,&this_00->length,value,valuelen);
      return iVar4;
    }
    pRVar2 = (this->super_RTPMemoryObject).mgr;
    pp_Var3 = (this_00->super_RTPMemoryObject)._vptr_RTPMemoryObject;
    if (pRVar2 == (RTPMemoryManager *)0x0) {
      (*pp_Var3[1])(this_00);
    }
    else {
      (**pp_Var3)(this_00);
      (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,this_00);
    }
  }
  return iVar4;
}

Assistant:

int RTCPSDESInfo::SetPrivateValue(const uint8_t *prefix,size_t prefixlen,const uint8_t *value,size_t valuelen)
{
	std::list<SDESPrivateItem *>::const_iterator it;
	bool found;
	
	found = false;
	it = privitems.begin();
	while (!found && it != privitems.end())
	{
		uint8_t *p;
		size_t l;
		
		p = (*it)->GetPrefix(&l);
		if (l == prefixlen)
		{
			if (l <= 0)
				found = true;
			else if (memcmp(prefix,p,l) == 0)
				found = true;
			else
				++it;
		}
		else
			++it;
	}
	
	SDESPrivateItem *item;
	
	if (found) // replace the value for this entry
		item = *it;
	else // no entry for this prefix found... add it
	{
		if (privitems.size() >= RTP_MAXPRIVITEMS) // too many items present, just ignore it
			return ERR_RTP_SDES_MAXPRIVITEMS;
		
		int status;
		
		item = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_SDESPRIVATEITEM) SDESPrivateItem(GetMemoryManager());
		if (item == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = item->SetPrefix(prefix,prefixlen)) < 0)
		{
			RTPDelete(item,GetMemoryManager());
			return status;
		}
		privitems.push_front(item);
	}
	return item->SetInfo(value,valuelen);
}